

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * flatbuffers::FloatToString<double>(string *__return_storage_ptr__,double t,int precision)

{
  _Setprecision _Var1;
  long lVar2;
  size_type p;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  int local_1c;
  double dStack_18;
  int precision_local;
  double t_local;
  __string_type *s;
  
  local_1c = precision;
  dStack_18 = t;
  t_local = (double)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::operator<<(local_198,std::fixed);
  _Var1 = std::setprecision(local_1c);
  std::operator<<(local_198,_Var1);
  std::ostream::operator<<(local_198,dStack_18);
  std::__cxx11::stringstream::str();
  lVar2 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
  if (lVar2 != -1) {
    std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatToString(T t, int precision) {
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    // to_string() prints different numbers of digits for floats depending on
    // platform and isn't available on Android, so we use stringstream
    std::stringstream ss;
    // Use std::fixed to suppress scientific notation.
    ss << std::fixed;
    // Default precision is 6, we want that to be higher for doubles.
    ss << std::setprecision(precision);
    ss << t;
    auto s = ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    auto v = static_cast<double>(t);
    auto s = NumToStringImplWrapper(v, "%0.*f", precision);
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
  // Sadly, std::fixed turns "1" into "1.00000", so here we undo that.
  auto p = s.find_last_not_of('0');
  if (p != std::string::npos) {
    // Strip trailing zeroes. If it is a whole number, keep one zero.
    s.resize(p + (s[p] == '.' ? 2 : 1));
  }
  return s;
}